

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O1

uintptr_t mmap_probe_seed(void)

{
  int __fd;
  uintptr_t in_RAX;
  ssize_t sVar1;
  uintptr_t val;
  uintptr_t local_18;
  
  local_18 = in_RAX;
  __fd = open64("/dev/urandom",0);
  if (__fd != -1) {
    sVar1 = read(__fd,&local_18,8);
    close(__fd);
    if (sVar1 == 8) {
      return local_18;
    }
  }
  return 1;
}

Assistant:

static uintptr_t mmap_probe_seed(void)
{
  uintptr_t val;
  int fd = open("/dev/urandom", O_RDONLY);
  if (fd != -1) {
    int ok = ((size_t)read(fd, &val, sizeof(val)) == sizeof(val));
    (void)close(fd);
    if (ok) return val;
  }
  return 1;  /* Punt. */
}